

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  j_compress_ptr in_RSI;
  long in_RDI;
  int m;
  int v2;
  int v;
  int ke;
  int k;
  int tbl;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr entropy;
  int local_40;
  int local_3c;
  int local_38;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  jpeg_error_mgr *pjVar3;
  uchar *st_00;
  
  st_00 = *(uchar **)(in_RDI + 0x1f0);
  if (*(int *)(in_RDI + 0x118) != 0) {
    if (*(int *)(st_00 + 0x60) == 0) {
      emit_restart((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      *(undefined4 *)(st_00 + 0x60) = *(undefined4 *)(in_RDI + 0x118);
      *(int *)(st_00 + 100) = *(int *)(st_00 + 100) + 1;
      *(uint *)(st_00 + 100) = *(uint *)(st_00 + 100) & 7;
    }
    *(int *)(st_00 + 0x60) = *(int *)(st_00 + 0x60) + -1;
  }
  pjVar3 = in_RSI->err;
  for (iVar2 = *(int *)(in_RDI + 0x1a0); 0 < iVar2; iVar2 = iVar2 + -1) {
    iVar1 = (int)*(short *)((long)&pjVar3->error_exit + (long)jpeg_natural_order[iVar2] * 2);
    if (iVar1 < 0) {
      iVar1 = -iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
    }
    else {
      iVar1 = iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
    }
    if (iVar1 != 0) break;
  }
  iVar1 = *(int *)(in_RDI + 0x19c);
LAB_00174403:
  iVar4 = (int)((ulong)pjVar3 >> 0x20);
  if (iVar2 < iVar1) {
    if (iVar1 <= *(int *)(in_RDI + 0x1a0)) {
      arith_encode(in_RSI,st_00,iVar4);
    }
    return 1;
  }
  arith_encode(in_RSI,st_00,iVar4);
  do {
    local_38 = (int)*(short *)((long)&pjVar3->error_exit + (long)jpeg_natural_order[iVar1] * 2);
    iVar4 = (int)((ulong)pjVar3 >> 0x20);
    if (local_38 < 0) {
      local_38 = -local_38 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
      if (local_38 != 0) break;
    }
    else {
      local_38 = local_38 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
      if (local_38 != 0) {
        arith_encode(in_RSI,st_00,iVar4);
        arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
        goto LAB_0017454a;
      }
    }
    arith_encode(in_RSI,st_00,iVar4);
    iVar1 = iVar1 + 1;
  } while( true );
  arith_encode(in_RSI,st_00,iVar4);
  arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
LAB_0017454a:
  local_40 = 0;
  if (local_38 + -1 != 0) {
    arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
    local_40 = 1;
    local_3c = local_38 + -1 >> 1;
    if (local_3c != 0) {
      arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
      local_40 = 2;
      while (local_3c = local_3c >> 1, local_3c != 0) {
        arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
        local_40 = local_40 << 1;
      }
    }
  }
  arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
  while (local_40 = local_40 >> 1, local_40 != 0) {
    arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
  }
  iVar1 = iVar1 + 1;
  goto LAB_00174403;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, temp2;
  register int nbits, r;
  int Sl = cinfo->Se - cinfo->Ss + 1;
  int Al = cinfo->Al;
  JCOEF values_unaligned[2 * DCTSIZE2 + 15];
  JCOEF *values;
  const JCOEF *cvalue;
  size_t zerobits;
  size_t bits[8 / SIZEOF_SIZE_T];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

#ifdef WITH_SIMD
  cvalue = values = (JCOEF *)PAD((JUINTPTR)values_unaligned, 16);
#else
  /* Not using SIMD, so alignment is not needed */
  cvalue = values = values_unaligned;
#endif

  /* Prepare data */
  entropy->AC_first_prepare(MCU_data[0][0], jpeg_natural_order + cinfo->Ss,
                            Sl, Al, values, bits);

  zerobits = bits[0];
#if SIZEOF_SIZE_T == 4
  zerobits |= bits[1];
#endif

  /* Emit any pending EOBRUN */
  if (zerobits && (entropy->EOBRUN > 0))
    emit_eobrun(entropy);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[0];
#endif

  /* Encode the AC coefficients per section G.1.2.2, fig. G.3 */

  ENCODE_COEFS_AC_FIRST((void)0;);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[1];
  if (zerobits) {
    int diff = ((values + DCTSIZE2 / 2) - cvalue);
    r = count_zeroes(&zerobits);
    r += diff;
    cvalue += r;
    goto first_iter_ac_first;
  }

  ENCODE_COEFS_AC_FIRST(first_iter_ac_first:);
#endif

  if (cvalue < (values + Sl)) { /* If there are trailing zeroes, */
    entropy->EOBRUN++;          /* count an EOB */
    if (entropy->EOBRUN == 0x7FFF)
      emit_eobrun(entropy);     /* force it out to avoid overflow */
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}